

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O1

void __thiscall Am_Drawonable_Impl::Allocate_Closest_Color(Am_Drawonable_Impl *this,XColor *c)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  int iVar3;
  long lVar4;
  ulong *puVar5;
  ulong uVar6;
  ostream *poVar7;
  long *plVar8;
  ulong *puVar9;
  ushort *puVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int n;
  XVisualInfo vit;
  int local_74;
  undefined1 local_70 [8];
  undefined8 local_68;
  
  iVar3 = XAllocColor(this->screen->display,this->screen->colormap,c);
  if (iVar3 == 0) {
    if (Allocate_Closest_Color(XColor&)::flag == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** No color cells left; using closest match.\n",0x2d);
      Allocate_Closest_Color(XColor&)::flag = '\x01';
    }
    local_68 = XVisualIDFromVisual(*(undefined8 *)
                                    (*(long *)(this->screen->display + 0xe8) + 0x40 +
                                    (long)this->screen->screen_number * 0x80));
    lVar4 = XGetVisualInfo(this->screen->display,1,local_70,&local_74);
    if (local_74 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "** X Error finding closest color match.  Using Black instead.\n",0x3e);
      XFree(lVar4);
      Paint_It_Black(c,this->screen->display,this->screen->colormap);
    }
    else {
      iVar3 = *(int *)(lVar4 + 0x38);
      uVar13 = (ulong)iVar3;
      XFree(lVar4);
      uVar6 = 0xffffffffffffffff;
      if (-1 < (long)uVar13) {
        uVar6 = uVar13 << 4;
      }
      puVar5 = (ulong *)operator_new__(uVar6);
      if (0 < (long)uVar13) {
        uVar6 = 0;
        puVar9 = puVar5;
        do {
          *puVar9 = uVar6;
          uVar6 = uVar6 + 1;
          puVar9 = puVar9 + 2;
        } while (uVar13 != uVar6);
      }
      XQueryColors(this->screen->display,this->screen->colormap,puVar5,iVar3);
      iVar11 = 0;
      if (1 < iVar3) {
        fVar14 = (float)(int)((uint)c->blue - (uint)*(ushort *)((long)puVar5 + 0xc));
        fVar15 = (float)(int)((uint)c->red - (uint)(ushort)puVar5[1]);
        fVar16 = (float)(int)((uint)c->green - (uint)*(ushort *)((long)puVar5 + 10));
        fVar14 = fVar14 * fVar14 + fVar15 * fVar15 + fVar16 * fVar16;
        puVar10 = (ushort *)((long)puVar5 + 0x1c);
        uVar12 = 0;
        uVar6 = 1;
        do {
          fVar15 = (float)(int)((uint)c->red - (uint)puVar10[-2]);
          fVar16 = (float)(int)((uint)c->green - (uint)puVar10[-1]);
          fVar17 = (float)(int)((uint)c->blue - (uint)*puVar10);
          fVar15 = fVar17 * fVar17 + fVar15 * fVar15 + fVar16 * fVar16;
          if (fVar15 < fVar14) {
            uVar12 = uVar6 & 0xffffffff;
          }
          iVar11 = (int)uVar12;
          if (fVar14 <= fVar15) {
            fVar15 = fVar14;
          }
          fVar14 = fVar15;
          uVar6 = uVar6 + 1;
          puVar10 = puVar10 + 8;
        } while (uVar13 != uVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   Wanted r",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", g",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", b",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   got    r",0xb);
      lVar4 = (long)iVar11;
      puVar1 = puVar5 + lVar4 * 2;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", g",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", b",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      fVar14 = (float)(int)((uint)c->red - (uint)(ushort)puVar5[lVar4 * 2 + 1]);
      fVar15 = (float)(int)((uint)c->green - (uint)*(ushort *)((long)puVar5 + lVar4 * 0x10 + 10));
      fVar16 = (float)(int)((uint)c->blue - (uint)*(ushort *)((long)puVar5 + lVar4 * 0x10 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  Error = ",10);
      std::ostream::_M_insert<double>((double)(fVar16 * fVar16 + fVar14 * fVar14 + fVar15 * fVar15))
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," error with cell i = ",0x15);
      plVar8 = (long *)std::ostream::operator<<(&std::cerr,iVar11);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      iVar3 = XAllocColor(this->screen->display,this->screen->colormap,puVar1);
      if (iVar3 == 0) {
        Paint_It_Black(c,this->screen->display,this->screen->colormap);
      }
      else {
        uVar2 = puVar1[1];
        c->pixel = *puVar1;
        c->red = (short)uVar2;
        c->green = (short)(uVar2 >> 0x10);
        c->blue = (short)(uVar2 >> 0x20);
        c->flags = (char)(uVar2 >> 0x30);
        c->pad = (char)(uVar2 >> 0x38);
      }
      operator_delete__(puVar5);
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Allocate_Closest_Color(XColor &c) const
{
  // if we have a match, do no work.
  if (XAllocColor(screen->display, screen->colormap, &c))
    return;

  static int flag = 0;
  if (!flag) {
    std::cerr << "** No color cells left; using closest match.\n";
    flag = 1;
  }

  // X manual claims that the following 7 or so lines of code are only
  // slightly less convenient than just using "V->colormap_size" which
  // isn't allowed in case they change the Visual structure.  Crap.
  Visual *V = DefaultVisual(screen->display, screen->screen_number);
  VisualID vid = XVisualIDFromVisual(V);
  XVisualInfo vit; // template
  vit.visualid = vid;
  int n;
  XVisualInfo *vi = XGetVisualInfo(screen->display, VisualIDMask, &vit, &n);
  if (n == 0) {
    std::cerr
        << "** X Error finding closest color match.  Using Black instead.\n";
    XFree(vi);
    Paint_It_Black(c, screen->display, screen->colormap);
    return;
  }
  int n_colors = vi->colormap_size;
  XFree(vi);

  int i;
  XColor *colors = new XColor[n_colors];
  // fill the array with pixel values we want the rgb's for.
  for (i = 0; i < n_colors; i++)
    colors[i].pixel = i;
  XQueryColors(screen->display, screen->colormap, colors, n_colors);
#if defined(_M_UNIX)
  float *ecolors = new float[n_colors];
  // Compute error colors for color table
  for (i = 0; i < n_colors; i++)
    ecolors[i] = color_error(c.red, colors[i].red, c.green, colors[i].green,
                             c.blue, colors[i].blue);
  // Sort array by base in error color
  for (i = 0; i < n_colors; i++) {
    int j;
    for (j = i + 1; j < n_colors; j++)
      if (ecolors[i] > ecolors[j]) {
        float t = ecolors[i];
        ecolors[i] = ecolors[j];
        ecolors[j] = t;
        XColor ct = colors[i];
        colors[i] = colors[j];
        colors[j] = ct;
      }
    if (XAllocColor(screen->display, screen->colormap, &colors[i])) {
      c = colors[i];
      delete[] ecolors;
      delete[] colors;
      return;
    }
  }
  Paint_It_Black(c, screen->display, screen->colormap);
  delete[] ecolors;
  delete[] colors;
#else
  float e;
  int index_of_min = 0;
  float min_error =
      color_error(c.red, colors[0].red, c.green, colors[0].green, c.blue,
                  colors[0].blue); // so we don't recalculate
  for (i = 1; i < n_colors; i++) { // skip cell 0: default values.
    e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                    colors[i].blue);
    if (e < min_error) {
      index_of_min = i;
      min_error = e;
    }
  }
  std::cerr << "   Wanted r" << c.red << ", g" << c.green << ", b" << c.blue
            << "\n";
  std::cerr << "   got    r" << colors[index_of_min].red << ", g"
            << colors[index_of_min].green << ", b" << colors[index_of_min].blue
            << "\n";
  e = color_error(c.red, colors[index_of_min].red, c.green,
                  colors[index_of_min].green, c.blue,
                  colors[index_of_min].blue);
  std::cerr << "  Error = " << e;
  e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                  colors[i].blue);
  std::cerr << " error with cell i = " << index_of_min << std::endl;
  if (XAllocColor(screen->display, screen->colormap, &colors[index_of_min]))
    c = colors[index_of_min];
  else
    Paint_It_Black(c, screen->display, screen->colormap);
  delete[] colors;
#endif
}